

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source-line-finder.cc
# Opt level: O2

Result __thiscall
wabt::LexerSourceLineFinder::GetLineOffsets
          (LexerSourceLineFinder *this,int find_line,OffsetRange *out_range)

{
  char cVar1;
  Result RVar2;
  pointer pRVar3;
  size_t sVar4;
  pointer pRVar5;
  Enum EVar6;
  char *pcVar7;
  iterator iter;
  pointer pcVar8;
  pointer pcVar9;
  OffsetRange OVar10;
  Offset line_offset;
  Offset buffer_file_offset;
  int local_64;
  vector<char,_std::allocator<char>_> buffer;
  
  if ((ulong)(long)find_line <
      (ulong)((long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->line_ranges_).
                    super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    OVar10 = GetCachedLine(this,find_line);
    *out_range = OVar10;
    EVar6 = Ok;
  }
  else {
    local_64 = find_line;
    std::vector<char,_std::allocator<char>_>::vector
              (&buffer,0x10000,(allocator_type *)&buffer_file_offset);
    pRVar5 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar3 = (this->line_ranges_).
             super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar5 == pRVar3) {
      __assert_fail("!line_ranges_.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/lexer-source-line-finder.cc"
                    ,0x58,"Result wabt::LexerSourceLineFinder::GetLineOffsets(int, OffsetRange *)");
    }
    buffer_file_offset = 0;
    while ((ulong)((long)pRVar3 - (long)pRVar5 >> 4) <= (ulong)(long)find_line) {
      if (this->eof_ != false) {
LAB_00157da7:
        EVar6 = Error;
        goto LAB_00157dc6;
      }
      RVar2 = LexerSource::Tell((this->source_)._M_t.
                                super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,
                                &buffer_file_offset);
      if (RVar2.enum_ == Error) goto LAB_00157da7;
      sVar4 = LexerSource::Fill((this->source_)._M_t.
                                super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>
                                .super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl,
                                buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                      .super__Vector_impl_data._M_finish -
                                (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                      .super__Vector_impl_data._M_start);
      if (sVar4 < (ulong)((long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start)) {
        this->eof_ = true;
      }
      pcVar7 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + sVar4;
      pcVar9 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pcVar8 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start; pcVar8 < pcVar7; pcVar8 = pcVar8 + 1) {
        cVar1 = *pcVar8;
        if (cVar1 == '\n') {
          line_offset = (Offset)(pcVar9 + ((buffer_file_offset -
                                           (long)buffer.
                                                 super__Vector_base<char,_std::allocator<char>_>.
                                                 _M_impl.super__Vector_impl_data._M_start) -
                                          (ulong)this->last_cr_));
          std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
          emplace_back<unsigned_long&,unsigned_long&>
                    ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>
                      *)&this->line_ranges_,&this->next_line_start_,&line_offset);
          this->next_line_start_ = line_offset + this->last_cr_ + 1;
          cVar1 = *pcVar8;
        }
        this->last_cr_ = cVar1 == '\r';
        pcVar9 = pcVar9 + 1;
      }
      if (this->eof_ != false) {
        line_offset = buffer_file_offset + sVar4;
        std::vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<wabt::Range<unsigned_long>,std::allocator<wabt::Range<unsigned_long>>> *)
                   &this->line_ranges_,&this->next_line_start_,&line_offset);
      }
      pRVar5 = (this->line_ranges_).
               super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar3 = (this->line_ranges_).
               super__Vector_base<wabt::Range<unsigned_long>,_std::allocator<wabt::Range<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    OVar10 = GetCachedLine(this,local_64);
    *out_range = OVar10;
    EVar6 = Ok;
LAB_00157dc6:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  }
  return (Result)EVar6;
}

Assistant:

Result LexerSourceLineFinder::GetLineOffsets(int find_line,
                                             OffsetRange* out_range) {
  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  }

  const size_t kBufferSize = 1 << 16;
  std::vector<char> buffer(kBufferSize);

  assert(!line_ranges_.empty());
  Offset buffer_file_offset = 0;
  while (!IsLineCached(find_line) && !eof_) {
    CHECK_RESULT(source_->Tell(&buffer_file_offset));
    size_t read_size = source_->Fill(buffer.data(), buffer.size());
    if (read_size < buffer.size()) {
      eof_ = true;
    }

    for (auto iter = buffer.begin(), end = iter + read_size; iter < end;
         ++iter) {
      if (*iter == '\n') {
        // Don't include \n or \r in the line range.
        Offset line_offset =
            buffer_file_offset + (iter - buffer.begin()) - last_cr_;
        line_ranges_.emplace_back(next_line_start_, line_offset);
        next_line_start_ = line_offset + last_cr_ + 1;
      }
      last_cr_ = *iter == '\r';
    }

    if (eof_) {
      // Add the final line as an empty range.
      Offset end = buffer_file_offset + read_size;
      line_ranges_.emplace_back(next_line_start_, end);
    }
  }

  if (IsLineCached(find_line)) {
    *out_range = GetCachedLine(find_line);
    return Result::Ok;
  } else {
    assert(eof_);
    return Result::Error;
  }
}